

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse2.cpp
# Opt level: O3

void qt_scale_image_argb32_on_argb32_sse2
               (uchar *destPixels,int dbpl,uchar *srcPixels,int sbpl,int srch,QRectF *targetRect,
               QRectF *sourceRect,QRect *clip,int const_alpha)

{
  uchar *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  Representation RVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uchar *puVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  int iVar20;
  undefined4 uVar21;
  uchar *puVar22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  long in_FS_OFFSET;
  double dVar30;
  int iVar31;
  int iVar33;
  undefined1 auVar32 [16];
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  double dVar37;
  ushort uVar38;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ushort uVar49;
  undefined1 auVar42 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ushort uVar52;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  undefined1 auVar53 [16];
  undefined1 auVar61 [16];
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (const_alpha == 0x100) {
    auVar32._0_8_ = sourceRect->w;
    auVar32._8_8_ = sourceRect->h;
    auVar8._0_8_ = targetRect->w;
    auVar8._8_8_ = targetRect->h;
    iVar20 = srch;
    QRectF::normalized();
    dVar34 = (double)((ulong)local_68 & 0x8000000000000000 | 0x3fe0000000000000) + local_68;
    dVar35 = dVar34;
    if (dVar34 <= -2147483648.0) {
      dVar35 = -2147483648.0;
    }
    dVar34 = (double)(-(ulong)(2147483647.0 < dVar34) & 0x41dfffffffc00000 |
                     ~-(ulong)(2147483647.0 < dVar34) & (ulong)dVar35);
    local_48.x1.m_i = (int)dVar34;
    dVar37 = (double)((ulong)local_60 & 0x8000000000000000 | 0x3fe0000000000000) + local_60;
    dVar35 = dVar37;
    if (dVar37 <= -2147483648.0) {
      dVar35 = -2147483648.0;
    }
    dVar37 = (double)(-(ulong)(2147483647.0 < dVar37) & 0x41dfffffffc00000 |
                     ~-(ulong)(2147483647.0 < dVar37) & (ulong)dVar35);
    RVar9.m_i = (int)dVar37;
    dVar35 = (local_68 - (double)(int)dVar34) * 0.5 + local_58;
    dVar35 = (double)((ulong)dVar35 & 0x8000000000000000 | 0x3fe0000000000000) + dVar35;
    bVar5 = 2147483647.0 < dVar35;
    if (dVar35 <= -2147483648.0) {
      dVar35 = -2147483648.0;
    }
    dVar37 = (local_60 - (double)(int)dVar37) * 0.5 + local_50;
    dVar37 = (double)((ulong)dVar37 & 0x8000000000000000 | 0x3fe0000000000000) + dVar37;
    dVar34 = dVar37;
    if (dVar37 <= -2147483648.0) {
      dVar34 = -2147483648.0;
    }
    local_48.x2.m_i =
         (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar35) +
         local_48.x1.m_i + -1;
    local_48.y1.m_i = RVar9.m_i;
    local_48.y2.m_i =
         (int)(double)(-(ulong)(2147483647.0 < dVar37) & 0x41dfffffffc00000 |
                      ~-(ulong)(2147483647.0 < dVar37) & (ulong)dVar34) + RVar9.m_i + -1;
    auVar61 = QRect::operator&(&local_48,clip);
    iVar26 = auVar61._0_4_;
    iVar28 = auVar61._4_4_;
    if (iVar28 <= auVar61._12_4_ && iVar26 <= auVar61._8_4_) {
      auVar32 = divpd(auVar32,auVar8);
      dVar35 = auVar32._0_8_;
      dVar34 = auVar32._8_8_;
      if (0.0 <= dVar35) {
        dVar30 = ceil((((double)iVar26 + 0.5) - targetRect->xp) * dVar35 * 65536.0);
        dVar37 = sourceRect->xp;
        iVar10 = -1;
      }
      else {
        dVar30 = floor((((double)iVar26 + 0.5) - (targetRect->xp + targetRect->w)) * dVar35 *
                       65536.0);
        dVar37 = sourceRect->xp + sourceRect->w;
        iVar10 = 1;
      }
      iVar31 = (int)(dVar35 * 65536.0);
      iVar33 = (int)(dVar34 * 65536.0);
      iVar6 = (int)(long)(dVar37 * 65536.0);
      uVar24 = iVar10 + iVar6 + (int)dVar30;
      if (0.0 <= dVar34) {
        dVar34 = ceil((((double)iVar28 + 0.5) - targetRect->yp) * dVar34 * 65536.0);
        dVar35 = sourceRect->yp;
        iVar29 = -1;
      }
      else {
        dVar34 = floor((((double)iVar28 + 0.5) - (targetRect->yp + targetRect->h)) * dVar34 *
                       65536.0);
        dVar35 = sourceRect->yp + sourceRect->h;
        iVar29 = 1;
      }
      auVar8 = _DAT_006be550;
      auVar32 = _DAT_006be540;
      uVar16 = (int)(long)(dVar35 * 65536.0) + iVar29 + (int)dVar34;
      auVar41._4_4_ = iVar31;
      auVar41._0_4_ = iVar31;
      auVar41._8_4_ = iVar33;
      auVar41._12_4_ = iVar33;
      uVar21 = movmskpd(iVar20,auVar41);
      bVar18 = ((byte)uVar21 & 2) >> 1 & srch <= (int)(uVar16 >> 0x10);
      iVar20 = 0;
      if (bVar18 != 0) {
        iVar20 = iVar33;
      }
      uVar16 = iVar20 + uVar16;
      iVar29 = (auVar61._12_4_ - iVar28) - (uint)bVar18;
      bVar18 = sbpl >> 2 <= (int)(uVar24 >> 0x10) & (byte)uVar21;
      iVar20 = 0;
      if (bVar18 != 0) {
        iVar20 = iVar31;
      }
      iVar25 = uVar24 + iVar20;
      iVar15 = (auVar61._8_4_ - iVar26) - (uint)bVar18;
      iVar7 = iVar29 + 1;
      if (srch <= (int)(iVar29 * iVar33 + uVar16 >> 0x10)) {
        iVar7 = iVar29;
      }
      iVar29 = iVar15 + 1;
      if (sbpl >> 2 <= (int)((uint)(iVar15 * iVar31 + iVar25) >> 0x10)) {
        iVar29 = iVar15;
      }
      if (0 < iVar7) {
        puVar22 = destPixels + (long)iVar26 * 4 + (long)(iVar28 * dbpl);
        uVar23 = (ulong)iVar29;
        puVar14 = destPixels + (long)(iVar28 * dbpl) + (long)iVar26 * 4;
        do {
          uVar19 = (ulong)((byte)-(char)((ulong)puVar14 >> 2) & 3);
          if (uVar23 < uVar19) {
            uVar19 = uVar23;
          }
          uVar17 = (ulong)(-(int)((ulong)puVar14 >> 2) & 3);
          if (uVar23 < uVar17) {
            uVar17 = uVar23;
          }
          uVar24 = (uVar16 >> 0x10) * sbpl;
          uVar13 = (ulong)(-((uint)((ulong)puVar22 >> 2) & 0x3fffffff) & 3);
          if (uVar23 <= uVar13) {
            uVar13 = uVar23;
          }
          uVar12 = 0;
          iVar26 = iVar25;
          if (uVar13 != 0) {
            uVar13 = 0;
            do {
              uVar12 = (ulong)(~*(uint *)(srcPixels + (long)(iVar26 >> 0x10) * 4 + (ulong)uVar24) >>
                              0x18) *
                       (((ulong)*(uint *)(puVar22 + uVar13 * 4) << 0x18 |
                        (ulong)*(uint *)(puVar22 + uVar13 * 4)) & 0xff00ff00ff00ff);
              uVar12 = uVar12 + 0x80008000800080 + (uVar12 >> 8 & 0xff00ff00ff00ff) >> 8 &
                       0xff00ff00ff00ff;
              *(uint *)(puVar22 + uVar13 * 4) =
                   ((uint)(uVar12 >> 0x18) | (uint)uVar12) +
                   *(uint *)(srcPixels + (long)(iVar26 >> 0x10) * 4 + (ulong)uVar24);
              iVar26 = iVar26 + iVar31;
              uVar13 = uVar13 + 1;
            } while (uVar19 != uVar13);
            uVar12 = uVar17 & 0xffffffff;
          }
          if ((int)uVar12 < iVar29 + -3) {
            iVar28 = iVar26 + iVar31 + iVar31;
            auVar61._4_4_ = iVar28;
            auVar61._0_4_ = iVar28 + iVar31;
            auVar61._12_4_ = iVar26;
            auVar61._8_4_ = iVar26 + iVar31;
            do {
              uVar11 = *(uint *)(srcPixels + (ulong)auVar61._2_2_ * 4 + (ulong)uVar24);
              uVar27 = *(uint *)(srcPixels + (ulong)auVar61._6_2_ * 4 + (ulong)uVar24);
              uVar3 = *(uint *)(srcPixels + (ulong)auVar61._10_2_ * 4 + (ulong)uVar24);
              uVar4 = *(uint *)(srcPixels + (ulong)auVar61._14_2_ * 4 + (ulong)uVar24);
              auVar51._0_4_ = -(uint)(0x7effffff < (int)(uVar4 ^ 0x80000000));
              auVar51._4_4_ = -(uint)(0x7effffff < (int)(uVar3 ^ 0x80000000));
              auVar51._8_4_ = -(uint)(0x7effffff < (int)(uVar27 ^ 0x80000000));
              auVar51._12_4_ = -(uint)(0x7effffff < (int)(uVar11 ^ 0x80000000));
              iVar26 = movmskps((uint)auVar61._2_2_,auVar51);
              if (iVar26 == 0xf) {
                puVar2 = (uint *)(puVar22 + uVar12 * 4);
                *puVar2 = uVar4;
                puVar2[1] = uVar3;
                puVar2[2] = uVar27;
                puVar2[3] = uVar11;
              }
              else {
                auVar39._0_4_ = -(uint)(-0x7f000001 < (int)(uVar4 ^ 0x80000000));
                auVar39._4_4_ = -(uint)(-0x7f000001 < (int)(uVar3 ^ 0x80000000));
                auVar39._8_4_ = -(uint)(-0x7f000001 < (int)(uVar27 ^ 0x80000000));
                auVar39._12_4_ = -(uint)(-0x7f000001 < (int)(uVar11 ^ 0x80000000));
                iVar26 = movmskps(iVar26,auVar39);
                if (iVar26 != 0) {
                  auVar40._0_4_ = uVar4 >> 0x18;
                  auVar40._4_4_ = uVar3 >> 0x18;
                  auVar40._8_4_ = uVar27 >> 0x18;
                  auVar40._12_4_ = uVar11 >> 0x18;
                  auVar50._0_4_ = auVar40._0_4_ << 0x10;
                  auVar50._4_4_ = auVar40._4_4_ << 0x10;
                  auVar50._8_4_ = auVar40._8_4_ << 0x10;
                  auVar50._12_4_ = auVar40._12_4_ << 0x10;
                  auVar51 = (auVar50 | auVar40) ^ auVar32;
                  auVar41 = *(undefined1 (*) [16])(puVar22 + uVar12 * 4);
                  uVar52 = (auVar41._0_2_ >> 8) * auVar51._0_2_;
                  uVar54 = (auVar41._2_2_ >> 8) * auVar51._2_2_;
                  uVar55 = (auVar41._4_2_ >> 8) * auVar51._4_2_;
                  uVar56 = (auVar41._6_2_ >> 8) * auVar51._6_2_;
                  uVar57 = (auVar41._8_2_ >> 8) * auVar51._8_2_;
                  uVar58 = (auVar41._10_2_ >> 8) * auVar51._10_2_;
                  uVar59 = (auVar41._12_2_ >> 8) * auVar51._12_2_;
                  uVar60 = (auVar41._14_2_ >> 8) * auVar51._14_2_;
                  auVar41 = auVar41 & auVar32;
                  uVar38 = auVar41._0_2_ * auVar51._0_2_;
                  uVar43 = auVar41._2_2_ * auVar51._2_2_;
                  uVar44 = auVar41._4_2_ * auVar51._4_2_;
                  uVar45 = auVar41._6_2_ * auVar51._6_2_;
                  uVar46 = auVar41._8_2_ * auVar51._8_2_;
                  uVar47 = auVar41._10_2_ * auVar51._10_2_;
                  uVar48 = auVar41._12_2_ * auVar51._12_2_;
                  uVar49 = auVar41._14_2_ * auVar51._14_2_;
                  auVar53._0_2_ = uVar52 + 0x80 + (uVar52 >> 8);
                  auVar53._2_2_ = uVar54 + 0x80 + (uVar54 >> 8);
                  auVar53._4_2_ = uVar55 + 0x80 + (uVar55 >> 8);
                  auVar53._6_2_ = uVar56 + 0x80 + (uVar56 >> 8);
                  auVar53._8_2_ = uVar57 + 0x80 + (uVar57 >> 8);
                  auVar53._10_2_ = uVar58 + 0x80 + (uVar58 >> 8);
                  auVar53._12_2_ = uVar59 + 0x80 + (uVar59 >> 8);
                  auVar53._14_2_ = uVar60 + 0x80 + (uVar60 >> 8);
                  auVar42._0_2_ = (ushort)(uVar38 + 0x80 + (uVar38 >> 8)) >> 8;
                  auVar42._2_2_ = (ushort)(uVar43 + 0x80 + (uVar43 >> 8)) >> 8;
                  auVar42._4_2_ = (ushort)(uVar44 + 0x80 + (uVar44 >> 8)) >> 8;
                  auVar42._6_2_ = (ushort)(uVar45 + 0x80 + (uVar45 >> 8)) >> 8;
                  auVar42._8_2_ = (ushort)(uVar46 + 0x80 + (uVar46 >> 8)) >> 8;
                  auVar42._10_2_ = (ushort)(uVar47 + 0x80 + (uVar47 >> 8)) >> 8;
                  auVar42._12_2_ = (ushort)(uVar48 + 0x80 + (uVar48 >> 8)) >> 8;
                  auVar42._14_2_ = (ushort)(uVar49 + 0x80 + (uVar49 >> 8)) >> 8;
                  auVar42 = auVar42 | auVar53 & auVar8;
                  puVar1 = puVar22 + uVar12 * 4;
                  *puVar1 = auVar42[0] + (char)uVar4;
                  puVar1[1] = auVar42[1] + (char)(uVar4 >> 8);
                  puVar1[2] = auVar42[2] + (char)(uVar4 >> 0x10);
                  puVar1[3] = auVar42[3] + (char)(uVar4 >> 0x18);
                  puVar1[4] = auVar42[4] + (char)uVar3;
                  puVar1[5] = auVar42[5] + (char)(uVar3 >> 8);
                  puVar1[6] = auVar42[6] + (char)(uVar3 >> 0x10);
                  puVar1[7] = auVar42[7] + (char)(uVar3 >> 0x18);
                  puVar1[8] = auVar42[8] + (char)uVar27;
                  puVar1[9] = auVar42[9] + (char)(uVar27 >> 8);
                  puVar1[10] = auVar42[10] + (char)(uVar27 >> 0x10);
                  puVar1[0xb] = auVar42[0xb] + (char)(uVar27 >> 0x18);
                  puVar1[0xc] = auVar42[0xc] + (char)uVar11;
                  puVar1[0xd] = auVar42[0xd] + (char)(uVar11 >> 8);
                  puVar1[0xe] = auVar42[0xe] + (char)(uVar11 >> 0x10);
                  puVar1[0xf] = auVar42[0xf] + (char)(uVar11 >> 0x18);
                }
              }
              auVar36._0_4_ = auVar61._0_4_ + iVar31 * 4;
              auVar36._4_4_ = auVar61._4_4_ + iVar31 * 4;
              auVar36._8_4_ = auVar61._8_4_ + iVar31 * 4;
              auVar36._12_4_ = auVar61._12_4_ + iVar31 * 4;
              uVar12 = uVar12 + 4;
              auVar61 = auVar36;
            } while ((long)uVar12 < (long)(iVar29 + -3));
          }
          if ((int)uVar12 < iVar29) {
            uVar19 = uVar12 & 0xffffffff;
            uVar11 = (int)uVar12 * iVar31 + (int)dVar30 + iVar6 + iVar20 + iVar10;
            uVar27 = 0;
            do {
              uVar19 = uVar19 + 1;
              uVar17 = (ulong)(~*(uint *)(srcPixels + (ulong)(uVar11 >> 0x10) * 4 + (ulong)uVar24)
                              >> 0x18) *
                       (((ulong)*(uint *)(puVar22 + uVar19 * 4 + -4) << 0x18 |
                        (ulong)*(uint *)(puVar22 + uVar19 * 4 + -4)) & 0xff00ff00ff00ff);
              uVar17 = uVar17 + 0x80008000800080 + (uVar17 >> 8 & 0xff00ff00ff00ff) >> 8 &
                       0xff00ff00ff00ff;
              *(uint *)(puVar22 + uVar19 * 4 + -4) =
                   ((uint)(uVar17 >> 0x18) | (uint)uVar17) +
                   *(uint *)(srcPixels + (ulong)(uVar11 >> 0x10) * 4 + (ulong)uVar24);
              if (1 < uVar27) break;
              uVar27 = uVar27 + 1;
              uVar11 = uVar11 + iVar31;
            } while ((long)uVar19 < (long)uVar23);
          }
          puVar22 = puVar22 + dbpl;
          uVar16 = uVar16 + iVar33;
          puVar14 = puVar14 + dbpl;
          bVar5 = 1 < iVar7;
          iVar7 = iVar7 + -1;
        } while (bVar5);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    qt_scale_image_argb32_on_argb32
              (destPixels,dbpl,srcPixels,sbpl,srch,targetRect,sourceRect,clip,const_alpha);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qt_scale_image_argb32_on_argb32_sse2(uchar *destPixels, int dbpl,
                                          const uchar *srcPixels, int sbpl, int srch,
                                          const QRectF &targetRect,
                                          const QRectF &sourceRect,
                                          const QRect &clip,
                                          int const_alpha)
{
    if (const_alpha != 256) {
        // from qblendfunctions.cpp
        extern void qt_scale_image_argb32_on_argb32(uchar *destPixels, int dbpl,
                                               const uchar *srcPixels, int sbpl, int srch,
                                               const QRectF &targetRect,
                                               const QRectF &sourceRect,
                                               const QRect &clip,
                                               int const_alpha);
        return qt_scale_image_argb32_on_argb32(destPixels, dbpl, srcPixels, sbpl, srch, targetRect, sourceRect, clip, const_alpha);
    }

    qreal sx = sourceRect.width() / (qreal)targetRect.width();
    qreal sy = sourceRect.height() / (qreal)targetRect.height();

    const int ix = 0x00010000 * sx;
    const int iy = 0x00010000 * sy;

    QRect tr = targetRect.normalized().toRect();
    tr = tr.intersected(clip);
    if (tr.isEmpty())
        return;
    const int tx1 = tr.left();
    const int ty1 = tr.top();
    int h = tr.height();
    int w = tr.width();

    quint32 basex;
    quint32 srcy;

    if (sx < 0) {
        int dstx = qFloor((tx1 + qreal(0.5) - targetRect.right()) * sx * 65536) + 1;
        basex = quint32(sourceRect.right() * 65536) + dstx;
    } else {
        int dstx = qCeil((tx1 + qreal(0.5) - targetRect.left()) * sx * 65536) - 1;
        basex = quint32(sourceRect.left() * 65536) + dstx;
    }
    if (sy < 0) {
        int dsty = qFloor((ty1 + qreal(0.5) - targetRect.bottom()) * sy * 65536) + 1;
        srcy = quint32(sourceRect.bottom() * 65536) + dsty;
    } else {
        int dsty = qCeil((ty1 + qreal(0.5) - targetRect.top()) * sy * 65536) - 1;
        srcy = quint32(sourceRect.top() * 65536) + dsty;
    }

    quint32 *dst = ((quint32 *) (destPixels + ty1 * dbpl)) + tx1;

    const __m128i nullVector = _mm_setzero_si128();
    const __m128i half = _mm_set1_epi16(0x80);
    const __m128i one = _mm_set1_epi16(0xff);
    const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);
    const __m128i alphaMask = _mm_set1_epi32(0xff000000);
    const __m128i ixVector = _mm_set1_epi32(4*ix);

    // this bounds check here is required as floating point rounding above might in some cases lead to
    // w/h values that are one pixel too large, falling outside of the valid image area.
    const int ystart = srcy >> 16;
    if (ystart >= srch && iy < 0) {
        srcy += iy;
        --h;
    }
    const int xstart = basex >> 16;
    if (xstart >=  (int)(sbpl/sizeof(quint32)) && ix < 0) {
        basex += ix;
        --w;
    }
    int yend = (srcy + iy * (h - 1)) >> 16;
    if (yend < 0 || yend >= srch)
        --h;
    int xend = (basex + ix * (w - 1)) >> 16;
    if (xend < 0 || xend >= (int)(sbpl/sizeof(quint32)))
        --w;

    while (--h >= 0) {
        const uint *src = (const quint32 *) (srcPixels + (srcy >> 16) * sbpl);
        int srcx = basex;
        int x = 0;

        ALIGNMENT_PROLOGUE_16BYTES(dst, x, w) {
            uint s = src[srcx >> 16];
            dst[x] = s + BYTE_MUL(dst[x], qAlpha(~s));
            srcx += ix;
        }

        __m128i srcxVector = _mm_set_epi32(srcx, srcx + ix, srcx + ix + ix, srcx + ix + ix + ix);

        for (; x < (w - 3); x += 4) {
            const int idx0 = _mm_extract_epi16(srcxVector, 1);
            const int idx1 = _mm_extract_epi16(srcxVector, 3);
            const int idx2 = _mm_extract_epi16(srcxVector, 5);
            const int idx3 = _mm_extract_epi16(srcxVector, 7);
            srcxVector = _mm_add_epi32(srcxVector, ixVector);

            const __m128i srcVector = _mm_set_epi32(src[idx0], src[idx1], src[idx2], src[idx3]);
            BLEND_SOURCE_OVER_ARGB32_SSE2_helper(dst, srcVector, nullVector, half, one, colorMask, alphaMask);
        }

        SIMD_EPILOGUE(x, w, 3) {
            uint s = src[(basex + x*ix) >> 16];
            dst[x] = s + BYTE_MUL(dst[x], qAlpha(~s));
        }
        dst = (quint32 *)(((uchar *) dst) + dbpl);
        srcy += iy;
    }
}